

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void message_written(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err)

{
  undefined8 *puVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  cio_error err_00;
  undefined4 in_register_00000014;
  cio_websocket_write_job *job;
  
  puVar1 = *(undefined8 **)((long)handler_context + 0x218);
  if (puVar1 == (undefined8 *)0x0) {
    job = (cio_websocket_write_job *)0x0;
  }
  else {
    if (puVar1 == *(undefined8 **)((long)handler_context + 0x220)) {
      job = (cio_websocket_write_job *)0x0;
    }
    else {
      job = (cio_websocket_write_job *)*puVar1;
    }
    *(cio_websocket_write_job **)((long)handler_context + 0x218) = job;
  }
  plVar2 = (long *)puVar1[1];
  plVar3 = (long *)*plVar2;
  if (plVar3 != (long *)0x0 && plVar3 != plVar2) {
    plVar2[2] = plVar2[2] + -1;
    plVar2[3] = plVar2[3] - plVar3[3];
    lVar4 = *plVar3;
    plVar2 = (long *)plVar3[1];
    *(long **)(lVar4 + 8) = plVar2;
    *plVar2 = lVar4;
    job = *(cio_websocket_write_job **)((long)handler_context + 0x218);
  }
  puVar1[1] = 0;
  (*(code *)puVar1[8])(handler_context,puVar1[9],CONCAT44(in_register_00000014,err));
  if (job != (cio_websocket_write_job *)0x0) {
    err_00 = send_frame((cio_websocket *)handler_context,job,(job->wbh->data).element.length);
    if (err_00 != CIO_SUCCESS) {
      handle_error((cio_websocket *)handler_context,err_00,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                   "could not send next frame");
      return;
    }
  }
  return;
}

Assistant:

static void message_written(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	const struct cio_websocket_write_job *job = write_jobs_popfront(websocket);
	struct cio_websocket_write_job *first_job = websocket->ws_private.first_write_job;

	job->handler(websocket, job->handler_context, err);

	if (first_job != NULL) {
		size_t length = cio_write_buffer_get_total_size(first_job->wbh);
		err = send_frame(websocket, first_job, length);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "could not send next frame");
		}
	}
}